

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

void __thiscall glu::Program::Program(Program *this,RenderContext *renderCtx,deUint32 program)

{
  int iVar1;
  GLenum err;
  undefined4 extraout_var;
  deUint32 program_00;
  int linkStatus;
  string local_48;
  Functions *pFVar2;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pFVar2 = (Functions *)CONCAT44(extraout_var,iVar1);
  this->m_gl = pFVar2;
  this->m_program = program;
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  local_48._M_dataplus._M_p._0_4_ = 0;
  (*pFVar2->getProgramiv)(program,0x8b82,(GLint *)&local_48);
  err = (*pFVar2->getError)();
  program_00 = 0x8e;
  checkError(err,"glGetProgramiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x8e);
  (this->m_info).linkOk = (int)local_48._M_dataplus._M_p != 0;
  getProgramInfoLog_abi_cxx11_(&local_48,(glu *)this->m_gl,(Functions *)(ulong)program,program_00);
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Program::Program (const RenderContext& renderCtx, deUint32 program)
	: m_gl		(renderCtx.getFunctions())
	, m_program	(program)
{
	m_info.linkOk	= getProgramLinkStatus(m_gl, program);
	m_info.infoLog	= getProgramInfoLog(m_gl, program);
}